

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  bool bVar2;
  HeapType type;
  Address i;
  ulong uVar3;
  pointer puVar4;
  undefined1 local_60 [8];
  Literal null;
  TableInterfaceInfo info;
  
  puVar1 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->wasm->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    bVar2 = wasm::Type::isNullable
                      (&((puVar4->_M_t).
                         super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
    if (bVar2) {
      getTableInterfaceInfo
                ((TableInterfaceInfo *)&null.type,this,
                 (IString)*(IString *)
                           &(((puVar4->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                            super_Importable).super_Named);
      type = wasm::Type::getHeapType
                       (&((puVar4->_M_t).
                          super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
                          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
      Literal::makeNull((Literal *)local_60,type);
      for (uVar3 = 0;
          uVar3 < (((puVar4->_M_t).
                    super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr;
          uVar3 = uVar3 + 1) {
        (**(code **)(*(long *)null.type.id + 0xe0))
                  (null.type.id,info.interface,info.name.super_IString.str._M_len,uVar3 & 0xffffffff
                   ,(Literal *)local_60);
      }
      Literal::~Literal((Literal *)local_60);
    }
  }
  wasm::ModuleUtils::
  iterActiveElementSegments<wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents()::_lambda(wasm::ElementSegment*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInterfaceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface->tableStore(info.name, i, null);
        }
      }
    }

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Address offset =
        (uint32_t)self()->visit(segment->offset).getSingleValue().geti32();

      Table* table = wasm.getTable(segment->table);
      ExternalInterface* extInterface = externalInterface;
      Name tableName = segment->table;
      if (table->imported()) {
        auto inst = linkedInstances.at(table->module);
        extInterface = inst->externalInterface;
        tableName = inst->wasm.getExport(table->base)->value;
      }

      for (Index i = 0; i < segment->data.size(); ++i) {
        Flow ret = self()->visit(segment->data[i]);
        extInterface->tableStore(tableName, offset + i, ret.getSingleValue());
      }
    });
  }